

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

Configuration * Configuration::i(void)

{
  if ((__uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>)
      instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
      super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
      super__Head_base<0UL,_Configuration_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>)0x0) {
    instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
    super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
    super__Head_base<0UL,_Configuration_*,_false>._M_head_impl =
         (__uniq_ptr_data<Configuration,_std::default_delete<Configuration>,_true,_true>)
         operator_new(0xa0);
    *(undefined ***)
     instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
     super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
     super__Head_base<0UL,_Configuration_*,_false>._M_head_impl = &PTR__Configuration_0019cf88;
    *(undefined4 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x20) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x10);
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x28) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x10);
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x30) = 0;
    *(undefined4 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x40) = 0;
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x48) = 0;
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x50) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x40);
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x58) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x40);
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x60) = 0;
    *(undefined4 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x70) = 0;
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x78) = 0;
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x80) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x70);
    *(undefined8 **)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x88) =
         (undefined8 *)
         ((long)instance._M_t.
                super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>._M_t.
                super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
                super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x70);
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x90) = 0;
    *(undefined8 *)
     ((long)instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
            _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
            super__Head_base<0UL,_Configuration_*,_false>._M_head_impl + 0x98) = 0;
  }
  return (Configuration *)
         (__uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>)
         instance._M_t.super___uniq_ptr_impl<Configuration,_std::default_delete<Configuration>_>.
         _M_t.super__Tuple_impl<0UL,_Configuration_*,_std::default_delete<Configuration>_>.
         super__Head_base<0UL,_Configuration_*,_false>._M_head_impl;
}

Assistant:

Configuration* Configuration::i()
{
	if (instance.get() == NULL)
	{
		instance.reset(new Configuration());
	}

	return instance.get();
}